

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_env_set_flags(MDB_env *env,uint flag,int onoff)

{
  if ((flag & 0xfeeaffff) != 0) {
    return 0x16;
  }
  if (onoff == 0) {
    env->me_flags = env->me_flags & ~flag;
  }
  else {
    env->me_flags = env->me_flags | flag;
  }
  return 0;
}

Assistant:

int ESECT
mdb_env_set_flags(MDB_env *env, unsigned int flag, int onoff)
{
	if (flag & ~CHANGEABLE)
		return EINVAL;
	if (onoff)
		env->me_flags |= flag;
	else
		env->me_flags &= ~flag;
	return MDB_SUCCESS;
}